

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_utils.cpp
# Opt level: O3

void amrex::single_level_weighted_redistribute
               (MultiFab *div_tmp_in,MultiFab *div_out,MultiFab *weights,int div_comp,int ncomp,
               Geometry *geom)

{
  EBCellFlagFab *this;
  FabType FVar1;
  long lVar2;
  int *piVar3;
  Box result_1;
  Box result;
  MFIter mfi;
  Box *in_stack_fffffffffffffed0;
  Box local_118;
  MultiFab *local_f8;
  MultiFab *local_f0;
  MultiFab *local_e8;
  Geometry *local_e0;
  Box local_d4;
  Box local_b8;
  MFIter local_90;
  
  local_e8 = weights;
  EB_set_covered(div_tmp_in,0,ncomp,
                 (div_tmp_in->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0],
                 1e+40);
  local_e0 = geom;
  local_90._0_12_ = Geometry::periodicity(geom);
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&div_tmp_in->super_FabArray<amrex::FArrayBox>,(Periodicity *)&local_90,false);
  local_f0 = div_tmp_in;
  MultiFab::Copy(div_out,div_tmp_in,0,div_comp,ncomp,0);
  lVar2 = __dynamic_cast((div_out->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo,0);
  if (lVar2 != 0) {
    local_f8 = EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar2 + 0xd8));
    MFIter::MFIter(&local_90,(FabArrayBase *)div_out,true);
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        MFIter::tilebox(&local_d4,&local_90);
        piVar3 = (int *)((long)((IntVect *)&local_90 + 2) + 8);
        if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar3 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + local_90.currentIndex;
        }
        this = (EBCellFlagFab *)
               (div_out->super_FabArray<amrex::FArrayBox>).m_fabs_v.
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[*piVar3][1].super_BaseFab<double>._vptr_BaseFab;
        local_b8.bigend.vect[2] = local_d4.bigend.vect[2];
        local_b8.btype.itype = local_d4.btype.itype;
        local_b8.smallend.vect[0] = local_d4.smallend.vect[0];
        local_b8.smallend.vect[1] = local_d4.smallend.vect[1];
        FVar1 = EBCellFlagFab::getType(this,&local_b8);
        if (FVar1 != covered) {
          local_118.bigend.vect[2] = local_d4.bigend.vect[2];
          local_118.btype.itype = local_d4.btype.itype;
          local_118.smallend.vect[0] = local_d4.smallend.vect[0];
          local_118.smallend.vect[1] = local_d4.smallend.vect[1];
          local_118.smallend.vect[2] = local_d4.smallend.vect[2] + -2;
          local_118.bigend.vect[0] = local_d4.bigend.vect[0] + 2;
          local_118.smallend.vect[1] = local_118.smallend.vect[1] + -2;
          local_118.smallend.vect[0] = local_118.smallend.vect[0] + -2;
          local_118.bigend.vect[1] = local_d4.bigend.vect[1] + 2;
          local_118.bigend.vect[2] = local_118.bigend.vect[2] + 2;
          FVar1 = EBCellFlagFab::getType(this,&local_118);
          if (FVar1 != regular) {
            apply_eb_redistribution
                      (&local_d4,div_out,local_f0,local_e8,&local_90,div_comp,ncomp,this,local_f8,
                       in_stack_fffffffffffffed0,local_e0);
          }
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    MFIter::~MFIter(&local_90);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void single_level_weighted_redistribute (MultiFab& div_tmp_in, MultiFab& div_out, const MultiFab& weights,
                                             int div_comp, int ncomp, const Geometry& geom)
    {
        Box domain(geom.Domain());

        Real covered_val = 1.e40;

        int nghost = 2;
        AMREX_ASSERT(div_tmp_in.nGrow() >= nghost);

        EB_set_covered(div_tmp_in, 0, ncomp, div_tmp_in.nGrow(), covered_val);

        div_tmp_in.FillBoundary(geom.periodicity());

        // Here we take care of both the regular and covered cases ... all we do below is the cut cell cases
        MultiFab::Copy(div_out, div_tmp_in, 0, div_comp, ncomp, 0);

        // Get EB geometric info
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(div_out.Factory());
        const MultiFab* volfrac   = &(ebfactory. getVolFrac());

        for (MFIter mfi(div_out,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            // Tilebox
            const Box& bx = mfi.tilebox ();

            // this is to check efficiently if this tile contains any eb stuff
            const EBFArrayBox&  div_fab = static_cast<EBFArrayBox const&>(div_out[mfi]);
            const EBCellFlagFab&  flags = div_fab.getEBCellFlagFab();

            if ( !(flags.getType(amrex::grow(bx,     0)) == FabType::covered) &&
                 !(flags.getType(amrex::grow(bx,nghost)) == FabType::regular) )
            {
                // Compute div(tau) with EB algorithm
                apply_eb_redistribution(bx, div_out, div_tmp_in, weights, &mfi,
                                               div_comp, ncomp, flags, volfrac, domain,
                                               geom);

            }
        }
    }